

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.cxx
# Opt level: O1

void __thiscall Fl_Widget::~Fl_Widget(Fl_Widget *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  this->_vptr_Fl_Widget = (_func_int **)&PTR__Fl_Widget_0024d448;
  Fl::clear_widget_pointer(this);
  if ((this->flags_ & 0x400) != 0) {
    free((this->label_).value);
  }
  if ((this->flags_ & 0x20000) != 0) {
    free(this->tooltip_);
  }
  if (this->parent_ != (Fl_Group *)0x0) {
    Fl_Group::remove(this->parent_,(char *)this);
  }
  this->parent_ = (Fl_Group *)0x0;
  fl_throw_focus(this);
  iVar2 = obj_head;
  if (this->callback_ == default_callback) {
    if (obj_tail != obj_head) {
      obj_head = obj_tail;
      iVar3 = obj_tail;
      iVar4 = obj_tail;
      do {
        lVar5 = (long)iVar4;
        bVar1 = 0x12 < iVar4;
        iVar4 = iVar4 + 1;
        if (bVar1) {
          iVar4 = 0;
        }
        if (obj_queue[lVar5] != this) {
          obj_head = iVar3 + 1;
          obj_queue[iVar3] = obj_queue[lVar5];
          bVar1 = 0x12 < iVar3;
          iVar3 = iVar3 + 1;
          if (bVar1) {
            obj_head = 0;
            iVar3 = 0;
          }
        }
      } while (iVar4 != iVar2);
    }
  }
  return;
}

Assistant:

Fl_Widget::~Fl_Widget() {
  Fl::clear_widget_pointer(this);
  if (flags() & COPIED_LABEL) free((void *)(label_.value));
  if (flags() & COPIED_TOOLTIP) free((void *)(tooltip_));
  // remove from parent group
  if (parent_) parent_->remove(this);
#ifdef DEBUG_DELETE
  if (parent_) { // this should never happen
    printf("*** Fl_Widget: parent_->remove(this) failed [%p,%p]\n",parent_,this);
  }
#endif // DEBUG_DELETE
  parent_ = 0; // Don't throw focus to a parent widget.
  fl_throw_focus(this);
  // remove stale entries from default callback queue (Fl::readqueue())
  if (callback_ == default_callback) cleanup_readqueue(this);
}